

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

nh_option_desc * clone_optlist(nh_option_desc *in)

{
  int iVar1;
  char *__s;
  nh_autopickup_rules *in_00;
  char **ppcVar2;
  uint uVar3;
  nh_option_desc *pnVar4;
  nh_msgtype_rules *pnVar5;
  long lVar6;
  
  uVar3 = 0;
  pnVar4 = in;
  do {
    uVar3 = uVar3 + 1;
    ppcVar2 = &pnVar4->name;
    pnVar4 = pnVar4 + 1;
  } while (*ppcVar2 != (char *)0x0);
  pnVar4 = (nh_option_desc *)malloc((ulong)uVar3 * 0x30);
  memcpy(pnVar4,in,(ulong)uVar3 * 0x30);
  lVar6 = 0x18;
  do {
    if (*(long *)((long)in + lVar6 + -0x18) == 0) {
      return pnVar4;
    }
    iVar1 = *(int *)((long)in + lVar6 + -8);
    if (iVar1 == 5) {
      pnVar5 = *(nh_msgtype_rules **)((long)&in->name + lVar6);
      if (pnVar5 != (nh_msgtype_rules *)0x0) {
        pnVar5 = copy_msgtype_rules(pnVar5);
        goto LAB_001fdc0b;
      }
    }
    else if (iVar1 == 4) {
      in_00 = *(nh_autopickup_rules **)((long)&in->name + lVar6);
      if (in_00 != (nh_autopickup_rules *)0x0) {
        pnVar5 = (nh_msgtype_rules *)copy_autopickup_rules(in_00);
        goto LAB_001fdc0b;
      }
    }
    else if ((iVar1 == 3) && (__s = *(char **)((long)&in->name + lVar6), __s != (char *)0x0)) {
      pnVar5 = (nh_msgtype_rules *)strdup(__s);
LAB_001fdc0b:
      *(nh_msgtype_rules **)((long)&pnVar4->name + lVar6) = pnVar5;
    }
    lVar6 = lVar6 + 0x30;
  } while( true );
}

Assistant:

struct nh_option_desc *clone_optlist(const struct nh_option_desc *in)
{
	int i;
	struct nh_option_desc *out;
	
	for (i = 0; in[i].name; i++)
	    ;
	i++;
	out = malloc(sizeof(struct nh_option_desc) * i);
	memcpy(out, in, sizeof(struct nh_option_desc) * i);
	
	for (i = 0; in[i].name; i++) {
	    if (in[i].type == OPTTYPE_STRING && in[i].value.s)
		out[i].value.s = strdup(in[i].value.s);
	    else if (in[i].type == OPTTYPE_AUTOPICKUP_RULES && in[i].value.ar)
		out[i].value.ar = copy_autopickup_rules(in[i].value.ar);
	    else if (in[i].type == OPTTYPE_MSGTYPE && in[i].value.mt)
		out[i].value.mt = copy_msgtype_rules(in[i].value.mt);
	}
	
	return out;
}